

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_viewport.cpp
# Opt level: O2

bool __thiscall
ON_Viewport::GetWorldToScreenScale(ON_Viewport *this,double frustum_depth,double *scale)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  double dVar8;
  double x;
  double local_40;
  double local_38;
  undefined8 uStack_30;
  
  if (scale != (double *)0x0) {
    *scale = 0.0;
  }
  if (this->m_bValidFrustum == false) {
    return false;
  }
  if (this->m_bValidPort == false) {
    return false;
  }
  local_38 = 1.0;
  uStack_30 = 0;
  if ((this->m_projection == perspective_view) &&
     (bVar1 = ON_IsValid(frustum_depth), 0.0 < frustum_depth && bVar1)) {
    if (this->m_frus_near <= 0.0) {
      return false;
    }
    local_38 = frustum_depth / this->m_frus_near;
    dVar4 = ABS(local_38);
    uStack_30 = 0;
    if ((0x3fe < (uint)((ulong)((long)dVar4 + -0x10000000000000) >> 0x35) || (long)local_38 < 0) &&
        ((0xffffffffffffe < (long)local_38 - 1U && (long)dVar4 < 0x7ff0000000000001) &&
        (dVar4 != 0.0 && dVar4 != INFINITY))) {
      return false;
    }
  }
  local_40 = 1.0;
  GetViewScale(this,&local_40,(double *)0x0);
  dVar4 = this->m_frus_right - this->m_frus_left;
  if (dVar4 == 0.0) {
    return false;
  }
  iVar2 = this->m_port_right - this->m_port_left;
  if (iVar2 == 0) {
    return false;
  }
  iVar3 = -iVar2;
  if (0 < iVar2) {
    iVar3 = iVar2;
  }
  dVar8 = (double)iVar3 /
          (ABS(dVar4) *
          (double)(~-(ulong)(local_40 != 0.0) & (ulong)local_38 |
                  (-(ulong)(local_40 != 1.0) & (ulong)(local_38 / ABS(local_40)) |
                  ~-(ulong)(local_40 != 1.0) & (ulong)local_38) & -(ulong)(local_40 != 0.0)));
  bVar7 = -1 < (long)dVar8;
  dVar4 = ABS(dVar8);
  bVar5 = 0xffffffffffffe < (long)dVar4 - 1U;
  bVar6 = 0x3fe < (uint)((ulong)((long)dVar4 + -0x10000000000000) >> 0x35);
  bVar1 = (bVar6 || bVar7) && (dVar4 != 0.0 && (bVar5 || bVar7));
  if (scale != (double *)0x0) {
    if ((bVar6 || bVar7) && (dVar4 != 0.0 && (bVar5 || bVar7))) {
      *scale = dVar8;
      return true;
    }
    return bVar1;
  }
  return bVar1;
}

Assistant:

bool ON_Viewport::GetWorldToScreenScale(
  double frustum_depth,
  double* scale
  ) const
{
  if (nullptr != scale)
    *scale = 0.0;

  if (false == m_bValidFrustum)
    return false;

  if (false == m_bValidPort)
    return false;

  double s = 1.0;

  if (IsPerspectiveProjection() && ON_IsValid(frustum_depth) && frustum_depth > 0.0)
  {
    if (!(m_frus_near > 0.0))
      return false;
    s = frustum_depth / m_frus_near;
    if (!(s >= 0.0) && ON_IS_FINITE(s))
      return false;
  }

  double x = 1.0;
  GetViewScale(&x, nullptr);
  if (x != 0.0 && 1.0 != x)
    s /= fabs(x);

  double fw = fabs(FrustumWidth());
  if (!(fw > 0.0))
    return false;

  fw *= s;

  double sw = fabs((double)ScreenPortWidth());
  if (!(sw > 0.0))
    return false;

  s = sw / fw;
  if (!(s > 0.0) && ON_IS_FINITE(s))
    return false;

  if (nullptr != scale)
    *scale = s;

  return true;
}